

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

Node * __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::CreateSurrogatePairAtom
          (Parser<UTF8EncodingPolicyBase<false>,_true> *this,char16 lower,char16 upper)

{
  MatchLiteralNode *this_00;
  undefined1 local_c0 [8];
  MatchCharNode lowerNode;
  MatchCharNode upperNode;
  
  this_00 = (MatchLiteralNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x35916e);
  MatchLiteralNode::MatchLiteralNode(this_00,0,0);
  MatchCharNode::MatchCharNode((MatchCharNode *)local_c0,lower);
  MatchCharNode::MatchCharNode((MatchCharNode *)&lowerNode.isEquivClass,upper);
  AccumLiteral(this,this_00,(Node *)local_c0);
  AccumLiteral(this,this_00,(Node *)&lowerNode.isEquivClass);
  return &this_00->super_Node;
}

Assistant:

Node* Parser<P, IsLiteral>::CreateSurrogatePairAtom(char16 lower, char16 upper)
    {
        MatchLiteralNode * literalNode = Anew(this->ctAllocator, MatchLiteralNode, 0, 0);
        MatchCharNode lowerNode(lower);
        MatchCharNode upperNode(upper);
        AccumLiteral(literalNode, &lowerNode);
        AccumLiteral(literalNode, &upperNode);

        return literalNode;
    }